

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> __thiscall
llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::try_emplace<llbuild::core::KeyID>
          (StringMap<llbuild::core::KeyID,_llvm::MallocAllocator> *this,StringRef Key,KeyID *Args)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntry<llbuild::core::KeyID> *pSVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  KeyID *in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> pVar6;
  StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  local_38;
  
  uVar2 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  local_38.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  if (*local_38.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar1 = &(this->super_StringMapImpl).NumTombstones;
    *puVar1 = *puVar1 - 1;
  }
  else if (*local_38.Ptr != (StringMapEntryBase *)0x0) {
    StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
    ::AdvancePastEmptyBuckets(&local_38);
    uVar5 = 0;
    goto LAB_00199b86;
  }
  Key_00.Length = (size_t)&this->field_0x18;
  Key_00.Data = (char *)Key.Length;
  pSVar4 = StringMapEntry<llbuild::core::KeyID>::Create<llvm::MallocAllocator,llbuild::core::KeyID>
                     ((StringMapEntry<llbuild::core::KeyID> *)Key.Data,Key_00,
                      (MallocAllocator *)Args,in_R8);
  *local_38.Ptr = &pSVar4->super_StringMapEntryBase;
  uVar3 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar3;
  if ((this->super_StringMapImpl).NumBuckets < uVar3 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<llbuild::core::KeyID>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = llbuild::core::KeyID, AllocatorTy = llvm::MallocAllocator, ArgsTy = <llbuild::core::KeyID>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar2);
  local_38.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  ::AdvancePastEmptyBuckets(&local_38);
  uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00199b86:
  pVar6._8_8_ = uVar5;
  pVar6.first.
  super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
          )(StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
            )local_38.Ptr;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }